

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

Layer * createLayerItem(Layer *layerData,VArenaAlloc *allocator)

{
  long in_RDI;
  Layer **in_stack_00000008;
  VArenaAlloc *in_stack_00000020;
  ImageLayer *local_8;
  
  switch(*(undefined1 *)(in_RDI + 0x31)) {
  case 0:
    local_8 = (ImageLayer *)
              VArenaAlloc::
              make<rlottie::internal::renderer::CompLayer,rlottie::internal::model::Layer*&,VArenaAlloc*&>
                        (in_stack_00000020,(Layer **)layerData,(VArenaAlloc **)allocator);
    break;
  case 1:
    local_8 = (ImageLayer *)
              VArenaAlloc::
              make<rlottie::internal::renderer::SolidLayer,rlottie::internal::model::Layer*&>
                        (allocator,in_stack_00000008);
    break;
  case 2:
    local_8 = VArenaAlloc::
              make<rlottie::internal::renderer::ImageLayer,rlottie::internal::model::Layer*&>
                        (allocator,in_stack_00000008);
    break;
  case 3:
    local_8 = (ImageLayer *)
              VArenaAlloc::
              make<rlottie::internal::renderer::NullLayer,rlottie::internal::model::Layer*&>
                        (allocator,in_stack_00000008);
    break;
  case 4:
    local_8 = (ImageLayer *)
              VArenaAlloc::
              make<rlottie::internal::renderer::ShapeLayer,rlottie::internal::model::Layer*&,VArenaAlloc*&>
                        (in_stack_00000020,(Layer **)layerData,(VArenaAlloc **)allocator);
    break;
  default:
    local_8 = (ImageLayer *)0x0;
  }
  return &local_8->super_Layer;
}

Assistant:

static renderer::Layer *createLayerItem(model::Layer *layerData,
                                        VArenaAlloc * allocator)
{
    switch (layerData->mLayerType) {
    case model::Layer::Type::Precomp: {
        return allocator->make<renderer::CompLayer>(layerData, allocator);
    }
    case model::Layer::Type::Solid: {
        return allocator->make<renderer::SolidLayer>(layerData);
    }
    case model::Layer::Type::Shape: {
        return allocator->make<renderer::ShapeLayer>(layerData, allocator);
    }
    case model::Layer::Type::Null: {
        return allocator->make<renderer::NullLayer>(layerData);
    }
    case model::Layer::Type::Image: {
        return allocator->make<renderer::ImageLayer>(layerData);
    }
    default:
        return nullptr;
        break;
    }
}